

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O1

QPromise<void> QtPromise::resolve(void)

{
  QSharedData *pQVar1;
  _func_int *p_Var2;
  PromiseData<void> *extraout_RDX;
  PromiseData<void> *extraout_RDX_00;
  PromiseData<void> *extraout_RDX_01;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar3;
  _func_int **in_RDI;
  QPromise<void> QVar4;
  PromiseResolver<void> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_40;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_38;
  QPromise<void> local_30;
  
  *in_RDI = (_func_int *)&PTR__QPromiseBase_00132658;
  p_Var2 = (_func_int *)operator_new(0x58);
  *(undefined8 *)p_Var2 = 0;
  *(undefined8 *)(p_Var2 + 8) = 0;
  *(undefined8 *)(p_Var2 + 0x10) = 0;
  *(undefined8 *)(p_Var2 + 0x18) = 0;
  *(undefined8 *)(p_Var2 + 0x20) = 0;
  *(undefined8 *)(p_Var2 + 0x28) = 0;
  *(undefined8 *)(p_Var2 + 0x30) = 0;
  *(undefined8 *)(p_Var2 + 0x38) = 0;
  *(undefined8 *)(p_Var2 + 0x40) = 0;
  *(undefined8 *)(p_Var2 + 0x48) = 0;
  *(undefined8 *)(p_Var2 + 0x50) = 0;
  *(undefined ***)p_Var2 = &PTR__PromiseDataBase_00132798;
  QReadWriteLock::QReadWriteLock((QReadWriteLock *)(p_Var2 + 0x10),0);
  p_Var2[0x18] = (code)0x0;
  *(undefined8 *)(p_Var2 + 0x20) = 0;
  *(undefined8 *)(p_Var2 + 0x28) = 0;
  *(undefined8 *)(p_Var2 + 0x30) = 0;
  *(undefined8 *)(p_Var2 + 0x38) = 0;
  *(undefined8 *)(p_Var2 + 0x40) = 0;
  *(undefined8 *)(p_Var2 + 0x48) = 0;
  *(undefined8 *)(p_Var2 + 0x50) = 0;
  *(undefined ***)p_Var2 = &PTR__PromiseDataBase_00132720;
  in_RDI[1] = p_Var2;
  LOCK();
  *(int *)(p_Var2 + 8) = *(int *)(p_Var2 + 8) + 1;
  UNLOCK();
  local_30.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)in_RDI[1];
  if (local_30.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_30.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_30.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001326e8;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver
            ((PromiseResolver<void> *)&local_38,&local_30);
  local_30.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00132658;
  if (local_30.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_30.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_30.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((local_30.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (local_38.d != (Data *)0x0) {
    LOCK();
    ((local_38.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_40.d = local_38.d;
  QtPromisePrivate::PromiseResolver<void>::resolve((PromiseResolver<void> *)&local_40);
  QVar3.d = extraout_RDX;
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_40.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_40.d != (Data *)0x0)) {
      operator_delete(local_40.d,0x10);
      QVar3.d = extraout_RDX_00;
    }
  }
  if (local_38.d != (Data *)0x0) {
    LOCK();
    ((local_38.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_38.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_38.d != (Data *)0x0)) {
      operator_delete(local_38.d,0x10);
      QVar3.d = extraout_RDX_01;
    }
  }
  *in_RDI = (_func_int *)&PTR__QPromiseBase_001326e8;
  QVar4.super_QPromiseBase<void>.m_d.d = QVar3.d;
  QVar4.super_QPromiseBase<void>._vptr_QPromiseBase = in_RDI;
  return (QPromise<void>)QVar4.super_QPromiseBase<void>;
}

Assistant:

static inline QPromise<void> resolve()
{
    return QPromise<void>{[](const QPromiseResolve<void>& resolve) {
        resolve();
    }};
}